

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCover.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverDup(Mvc_Cover_t *p)

{
  Mvc_Cover_t *pMVar1;
  Mvc_Cube_t *pMVar2;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover;
  Mvc_Cover_t *p_local;
  
  pMVar1 = Mvc_CoverClone(p);
  for (pCubeCopy = (p->lCubes).pHead; pCubeCopy != (Mvc_Cube_t *)0x0; pCubeCopy = pCubeCopy->pNext)
  {
    pMVar2 = Mvc_CubeDup(p,pCubeCopy);
    if ((pMVar1->lCubes).pHead == (Mvc_Cube_t *)0x0) {
      (pMVar1->lCubes).pHead = pMVar2;
    }
    else {
      ((pMVar1->lCubes).pTail)->pNext = pMVar2;
    }
    (pMVar1->lCubes).pTail = pMVar2;
    pMVar2->pNext = (Mvc_Cube_t *)0x0;
    (pMVar1->lCubes).nItems = (pMVar1->lCubes).nItems + 1;
  }
  return pMVar1;
}

Assistant:

Mvc_Cover_t * Mvc_CoverDup( Mvc_Cover_t * p )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeDup( p, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    return pCover;
}